

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::SubjectSetRegisterTest_test_comparator_with_realistic_subjects_Test
::TestBody(SubjectSetRegisterTest_test_comparator_with_realistic_subjects_Test *this)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  reference pSVar2;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  *rhs;
  char *message;
  AssertHelper local_1b8;
  Message local_1b0;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> local_1a8;
  undefined1 local_138 [8];
  AssertionResult gtest_ar;
  Subject local_110 [8];
  Subject subject;
  __normal_iterator<bidfx_public_api::price::subject::Subject_*,_std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
  local_f8;
  iterator __end3;
  iterator __begin3;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  *__range3;
  SubjectSetRegister local_d0 [8];
  SubjectSetRegister subject_register;
  int local_40;
  int i;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_30;
  default_random_engine rng;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  shuffle_input;
  SubjectSetRegisterTest_test_comparator_with_realistic_subjects_Test *this_local;
  
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)&rng,(vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                    *)RealSubscriptionExample::REAL_SORTED_LIST);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&local_30);
  for (local_40 = 0; local_40 < 100; local_40 = local_40 + 1) {
    bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_d0);
    __first = std::
              begin<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>
                        ((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                          *)&rng);
    __last = std::
             end<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>
                       ((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                         *)&rng);
    std::
    shuffle<__gnu_cxx::__normal_iterator<bidfx_public_api::price::subject::Subject*,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
              ((__normal_iterator<bidfx_public_api::price::subject::Subject_*,_std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
                )__first._M_current,
               (__normal_iterator<bidfx_public_api::price::subject::Subject_*,_std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
                )__last._M_current,&local_30);
    __end3 = std::
             vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
             ::begin((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                      *)&rng);
    local_f8._M_current =
         (Subject *)
         std::
         vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
         ::end((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                *)&rng);
    while (bVar1 = __gnu_cxx::operator!=(&__end3,&local_f8), bVar1) {
      pSVar2 = __gnu_cxx::
               __normal_iterator<bidfx_public_api::price::subject::Subject_*,_std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
               ::operator*(&__end3);
      bidfx_public_api::price::subject::Subject::Subject(local_110,pSVar2);
      bidfx_public_api::price::subject::Subject::Subject((Subject *)&gtest_ar.message_,local_110);
      bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_d0,&gtest_ar.message_,0);
      price::subject::Subject::~Subject((Subject *)&gtest_ar.message_);
      price::subject::Subject::~Subject(local_110);
      __gnu_cxx::
      __normal_iterator<bidfx_public_api::price::subject::Subject_*,_std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
      ::operator++(&__end3);
    }
    bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
    std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator->(&local_1a8);
    rhs = (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
           *)bidfx_public_api::price::pixie::SubscriptionSync::GetSubjects();
    testing::internal::EqHelper<false>::
    Compare<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>
              ((EqHelper<false> *)local_138,"RealSubscriptionExample::REAL_SORTED_LIST",
               "subject_register.NextSubscriptionSync()->GetSubjects()",
               (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                *)RealSubscriptionExample::REAL_SORTED_LIST,rhs);
    std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional(&local_1a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_138);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
                 ,0x1de,message);
      testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper(&local_1b8);
      testing::Message::~Message(&local_1b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
    SubjectSetRegister::~SubjectSetRegister(local_d0);
  }
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
             *)&rng);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_comparator_with_realistic_subjects)
{
    std::vector<Subject> shuffle_input(RealSubscriptionExample::REAL_SORTED_LIST);
    auto rng = std::default_random_engine {};

    for (int i = 0; i < 100; i++)
    {
        SubjectSetRegister subject_register = SubjectSetRegister();
        std::shuffle(std::begin(shuffle_input), std::end(shuffle_input), rng);

        for (Subject subject : shuffle_input)
        {
            subject_register.Register(std::move(subject), false);
        }

        EXPECT_EQ(RealSubscriptionExample::REAL_SORTED_LIST, subject_register.NextSubscriptionSync()->GetSubjects());
    }
}